

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inipp.h
# Opt level: O2

Symbols * __thiscall
inipp::Ini<char>::global_symbols_abi_cxx11_(Symbols *__return_storage_ptr__,Ini<char> *this)

{
  _Base_ptr p_Var1;
  _Rb_tree_node_base *p_Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (p_Var2 = (this->sections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->sections)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    for (p_Var1 = p_Var2[2]._M_right; p_Var1 != (_Base_ptr)&p_Var2[2]._M_parent;
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
      Format<char>::global_symbol
                (&local_50,
                 (this->format).super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (p_Var2 + 1),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 1));
      std::
      vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<std::__cxx11::string_const,std::__cxx11::string_const&>
                ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  *)__return_storage_ptr__,&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 2));
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const Symbols global_symbols() const {
		Symbols result;
		for (const auto & sec : sections)
			for (const auto & val : sec.second)
				result.emplace_back(format->global_symbol(sec.first, val.first), val.second);
		return result;
	}